

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O0

void szipInitStream(SZIPLookToRead *stream,PHYSFS_Io *io)

{
  PHYSFS_Io *io_local;
  SZIPLookToRead *stream_local;
  
  (stream->seekStream).Read = SZIP_ISeekInStream_Read;
  (stream->seekStream).Seek = SZIP_ISeekInStream_Seek;
  stream->io = io;
  LookToRead_Init(&stream->lookStream);
  LookToRead_CreateVTable(&stream->lookStream,0);
  (stream->lookStream).realStream = &stream->seekStream;
  return;
}

Assistant:

static void szipInitStream(SZIPLookToRead *stream, PHYSFS_Io *io)
{
    stream->seekStream.Read = SZIP_ISeekInStream_Read;
    stream->seekStream.Seek = SZIP_ISeekInStream_Seek;

    stream->io = io;

    /* !!! FIXME: can we use lookahead? Is there value to it? */
    LookToRead_Init(&stream->lookStream);
    LookToRead_CreateVTable(&stream->lookStream, False);
    stream->lookStream.realStream = &stream->seekStream;
}